

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O0

JsErrorCode JsGetModuleNamespace(JsModuleRecord requestModule,JsValueRef *moduleNamespace)

{
  bool bVar1;
  int iVar2;
  SourceTextModuleRecord *this;
  Var pvVar3;
  undefined4 extraout_var;
  SourceTextModuleRecord *moduleRecord;
  JsValueRef *moduleNamespace_local;
  JsModuleRecord requestModule_local;
  
  if (moduleNamespace == (JsValueRef *)0x0) {
    requestModule_local._4_4_ = JsErrorNullArgument;
  }
  else {
    *moduleNamespace = (JsValueRef)0x0;
    bVar1 = Js::SourceTextModuleRecord::Is(requestModule);
    if (bVar1) {
      this = Js::SourceTextModuleRecord::FromHost(requestModule);
      bVar1 = Js::ModuleRecordBase::WasEvaluated(&this->super_ModuleRecordBase);
      if (bVar1) {
        pvVar3 = Js::SourceTextModuleRecord::GetErrorObject(this);
        if (pvVar3 == (Var)0x0) {
          iVar2 = (*(this->super_ModuleRecordBase).super_FinalizableObject.
                    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[6])();
          *moduleNamespace = (JsValueRef)CONCAT44(extraout_var,iVar2);
          requestModule_local._4_4_ = JsNoError;
        }
        else {
          requestModule_local._4_4_ = JsErrorInvalidArgument;
        }
      }
      else {
        requestModule_local._4_4_ = JsErrorModuleNotEvaluated;
      }
    }
    else {
      requestModule_local._4_4_ = JsErrorInvalidArgument;
    }
  }
  return requestModule_local._4_4_;
}

Assistant:

CHAKRA_API JsGetModuleNamespace(_In_ JsModuleRecord requestModule, _Outptr_result_maybenull_ JsValueRef *moduleNamespace)
{
    PARAM_NOT_NULL(moduleNamespace);
    *moduleNamespace = nullptr;
    if (!Js::SourceTextModuleRecord::Is(requestModule))
    {
        return JsErrorInvalidArgument;
    }
    Js::SourceTextModuleRecord* moduleRecord = Js::SourceTextModuleRecord::FromHost(requestModule);
    if (!moduleRecord->WasEvaluated())
    {
        return JsErrorModuleNotEvaluated;
    }
    if (moduleRecord->GetErrorObject() != nullptr)
    {
        return JsErrorInvalidArgument;
    }
    *moduleNamespace = static_cast<JsValueRef>(moduleRecord->GetNamespace());
    return JsNoError;
}